

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableType.cpp
# Opt level: O1

void __thiscall rsg::VariableType::VariableType(VariableType *this,VariableType *other)

{
  (this->m_typeName)._M_dataplus._M_p = (pointer)&(this->m_typeName).field_2;
  (this->m_typeName)._M_string_length = 0;
  (this->m_typeName).field_2._M_local_buf[0] = '\0';
  this->m_elementType = (VariableType *)0x0;
  (this->m_members).
  super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_members).
  super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_members).
  super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  operator=(this,other);
  return;
}

Assistant:

VariableType::VariableType (const VariableType& other)
	: m_elementType(DE_NULL)
{
	*this = other;
}